

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O0

HPDF_OutputIntent
HPDF_OutputIntent_New
          (HPDF_Doc pdf,char *identifier,char *condition,char *registry,char *info,
          HPDF_Array outputprofile)

{
  HPDF_BOOL HVar1;
  HPDF_STATUS HVar2;
  HPDF_STATUS HVar3;
  HPDF_String p_Var4;
  HPDF_STATUS HVar5;
  HPDF_STATUS HVar6;
  HPDF_STATUS HVar7;
  long local_50;
  HPDF_STATUS ret;
  HPDF_OutputIntent intent;
  HPDF_Array outputprofile_local;
  char *info_local;
  char *registry_local;
  char *condition_local;
  char *identifier_local;
  HPDF_Doc pdf_local;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    pdf_local = (HPDF_Doc)0x0;
  }
  else {
    pdf_local = (HPDF_Doc)HPDF_Dict_New(pdf->mmgr);
    if (pdf_local == (HPDF_Doc)0x0) {
      pdf_local = (HPDF_Doc)0x0;
    }
    else {
      HVar2 = HPDF_Xref_Add(pdf->xref,pdf_local);
      if (HVar2 == 0) {
        HVar2 = HPDF_Dict_AddName((HPDF_Dict)pdf_local,"Type","OutputIntent");
        HVar3 = HPDF_Dict_AddName((HPDF_Dict)pdf_local,"S","GTS_PDFX");
        p_Var4 = HPDF_String_New(pdf->mmgr,identifier,(HPDF_Encoder_conflict)0x0);
        HVar5 = HPDF_Dict_Add((HPDF_Dict)pdf_local,"OutputConditionIdentifier",p_Var4);
        p_Var4 = HPDF_String_New(pdf->mmgr,condition,(HPDF_Encoder_conflict)0x0);
        HVar6 = HPDF_Dict_Add((HPDF_Dict)pdf_local,"OutputCondition",p_Var4);
        p_Var4 = HPDF_String_New(pdf->mmgr,registry,(HPDF_Encoder_conflict)0x0);
        HVar7 = HPDF_Dict_Add((HPDF_Dict)pdf_local,"RegistryName",p_Var4);
        local_50 = HVar7 + HVar6 + HVar5 + HVar3 + HVar2;
        if (info != (char *)0x0) {
          p_Var4 = HPDF_String_New(pdf->mmgr,info,(HPDF_Encoder_conflict)0x0);
          HVar2 = HPDF_Dict_Add((HPDF_Dict)pdf_local,"Info",p_Var4);
          local_50 = HVar2 + local_50;
        }
        if (outputprofile != (HPDF_Array)0x0) {
          HVar2 = HPDF_Dict_Add((HPDF_Dict)pdf_local,"DestOutputProfile ",outputprofile);
          local_50 = HVar2 + local_50;
        }
        if (local_50 != 0) {
          HPDF_Dict_Free((HPDF_Dict)pdf_local);
          pdf_local = (HPDF_Doc)0x0;
        }
      }
      else {
        HPDF_Dict_Free((HPDF_Dict)pdf_local);
        pdf_local = (HPDF_Doc)0x0;
      }
    }
  }
  return (HPDF_OutputIntent)pdf_local;
}

Assistant:

HPDF_EXPORT(HPDF_OutputIntent)
HPDF_OutputIntent_New  (HPDF_Doc  pdf,
                      const char* identifier,
                      const char* condition,
                      const char* registry,
                      const char* info,
                      HPDF_Array  outputprofile)
{
    HPDF_OutputIntent intent;
    HPDF_STATUS ret = HPDF_OK;

    HPDF_PTRACE((" HPDF_OutputIntent_New\n"));

    if (!HPDF_HasDoc (pdf))
        return NULL;

    intent = HPDF_Dict_New (pdf->mmgr);
    if (!intent)
        return NULL;

    if (HPDF_Xref_Add (pdf->xref, intent) != HPDF_OK) {
        HPDF_Dict_Free(intent);
        return NULL;
    }

    ret += HPDF_Dict_AddName (intent, "Type", "OutputIntent");
    ret += HPDF_Dict_AddName (intent, "S", "GTS_PDFX");
    ret += HPDF_Dict_Add (intent, "OutputConditionIdentifier", HPDF_String_New (pdf->mmgr, identifier, NULL));
    ret += HPDF_Dict_Add (intent, "OutputCondition", HPDF_String_New (pdf->mmgr, condition,NULL));
    ret += HPDF_Dict_Add (intent, "RegistryName", HPDF_String_New (pdf->mmgr, registry, NULL));

    if (info != NULL) {
        ret += HPDF_Dict_Add (intent, "Info", HPDF_String_New (pdf->mmgr, info, NULL));
    }

    /* add ICC base stream */
    if (outputprofile != NULL) {
        ret += HPDF_Dict_Add (intent, "DestOutputProfile ", outputprofile);
    }

    if (ret != HPDF_OK) {
        HPDF_Dict_Free(intent);
        return NULL;
    }

    return intent;
}